

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *local_28;
  char *ptr2_local;
  char *ptr1_local;
  ENCODING *enc_local;
  
  local_28 = (byte *)ptr2;
  ptr2_local = ptr1;
  do {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr2_local)) {
    case 7:
      bVar1 = *ptr2_local;
      bVar2 = *local_28;
      local_28 = local_28 + 1;
      ptr2_local = ptr2_local + 1;
      if (bVar1 != bVar2) {
        return 0;
      }
    case 6:
      bVar1 = *ptr2_local;
      bVar2 = *local_28;
      local_28 = local_28 + 1;
      ptr2_local = ptr2_local + 1;
      if (bVar1 != bVar2) {
        return 0;
      }
    case 5:
      pbVar4 = (byte *)(ptr2_local + 1);
      pbVar5 = local_28 + 1;
      if (*ptr2_local != *local_28) {
        return 0;
      }
      ptr2_local = ptr2_local + 2;
      local_28 = local_28 + 2;
      if (*pbVar4 != *pbVar5) {
        return 0;
      }
      break;
    default:
      if (*ptr2_local == *local_28) {
        return 1;
      }
      uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_28);
      if ((((2 < uVar3 - 5) && (uVar3 != 0x16)) && (3 < uVar3 - 0x18)) && (uVar3 != 0x1d)) {
        return 1;
      }
      return 0;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      bVar1 = *local_28;
      bVar2 = *ptr2_local;
      local_28 = local_28 + 1;
      ptr2_local = ptr2_local + 1;
      if (bVar1 != bVar2) {
        return 0;
      }
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}